

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::ResolveAndPlan
          (PhysicalPlanGenerator *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  PhysicalOperator *pPVar1;
  QueryProfiler *this_00;
  type op_00;
  pointer this_01;
  pointer pPVar2;
  ColumnBindingResolver resolver;
  undefined1 local_48 [16];
  __node_base local_38;
  
  this_00 = QueryProfiler::Get(this->context);
  QueryProfiler::StartPhase(this_00,PHYSICAL_PLANNER_COLUMN_BINDING);
  ColumnBindingResolver::ColumnBindingResolver((ColumnBindingResolver *)(local_48 + 8),false);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(op);
  ColumnBindingResolver::VisitOperator((ColumnBindingResolver *)(local_48 + 8),op_00);
  QueryProfiler::EndPhase(this_00);
  QueryProfiler::StartPhase(this_00,PHYSICAL_PLANNER_RESOLVE_TYPES);
  this_01 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(op);
  LogicalOperator::ResolveOperatorTypes(this_01);
  QueryProfiler::EndPhase(this_00);
  QueryProfiler::StartPhase(this_00,PHYSICAL_PLANNER_CREATE_PLAN);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::operator*
            (op);
  PlanInternal((PhysicalPlanGenerator *)local_48,(LogicalOperator *)this);
  ::std::__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>::reset
            ((__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> *)
             &this->physical_plan,(pointer)local_48._0_8_);
  QueryProfiler::EndPhase(this_00);
  pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&this->physical_plan);
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar2->root);
  pPVar1 = (pPVar2->root).ptr;
  local_48._8_8_ = &PTR__ColumnBindingResolver_02467980;
  if (local_38._M_nxt != (_Hash_node_base *)0x0) {
    operator_delete(local_38._M_nxt);
  }
  return pPVar1;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::ResolveAndPlan(unique_ptr<LogicalOperator> op) {
	auto &profiler = QueryProfiler::Get(context);

	// Resolve the column references.
	profiler.StartPhase(MetricsType::PHYSICAL_PLANNER_COLUMN_BINDING);
	ColumnBindingResolver resolver;
	resolver.VisitOperator(*op);
	profiler.EndPhase();

	// Resolve the types of each operator.
	profiler.StartPhase(MetricsType::PHYSICAL_PLANNER_RESOLVE_TYPES);
	op->ResolveOperatorTypes();
	profiler.EndPhase();

	// Create the main physical plan.
	profiler.StartPhase(MetricsType::PHYSICAL_PLANNER_CREATE_PLAN);
	physical_plan = PlanInternal(*op);
	profiler.EndPhase();

	// Return a reference to the root of this plan.
	return physical_plan->Root();
}